

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<ProString>::relocate
          (QArrayDataPointer<ProString> *this,qsizetype offset,ProString **data)

{
  ProString *d_first;
  ProString *pPVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<ProString,long_long>(this->ptr,this->size,d_first);
  if (data != (ProString **)0x0) {
    pPVar1 = *data;
    if ((this->ptr <= pPVar1) && (pPVar1 < this->ptr + this->size)) {
      *data = pPVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }